

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O0

void freehand_create_proc(Am_Object *cmd)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Value *pAVar7;
  ulong uVar8;
  Am_Wrapper *pAVar9;
  Am_Object *pAVar10;
  ostream *poVar11;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object parent_cmd;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object new_object;
  Am_Style local_50 [8];
  Am_Style color;
  Am_Inter_Location local_40 [8];
  Am_Inter_Location data;
  int height;
  int width;
  int top;
  int left;
  Am_Object local_18;
  Am_Object inter;
  Am_Object *cmd_local;
  
  inter.data = (Am_Object_Data *)cmd;
  Am_Object::Am_Object(&local_18);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)cmd,0x170);
  Am_Object::operator=(&local_18,pAVar6);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x138);
  iVar2 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x13a);
  iVar3 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x139);
  iVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = (Am_Value *)Am_Object::Get((ushort)&local_18,0x13b);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  Am_Object::Get_Owner((Am_Object *)&color,(Am_Slot_Flags)&local_18);
  Am_Inter_Location::Am_Inter_Location
            (local_40,false,(Am_Object *)&color,iVar2,iVar3,iVar4 - iVar2,iVar5 - iVar3,true,true);
  Am_Object::~Am_Object((Am_Object *)&color);
  Am_Object::Get_Object((ushort)&new_object,0x11c6f0);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&new_object,0x6a);
  Am_Style::Am_Style(local_50,pAVar6);
  Am_Object::~Am_Object(&new_object);
  Am_Object::Create((char *)&local_68);
  uVar8 = Am_Object::Get((ushort)&local_18,0xb2);
  uVar1 = Am_Object::Set((ushort)&local_68,(Am_Value *)0xb2,uVar8);
  pAVar9 = Am_Style::operator_cast_to_Am_Wrapper_(local_50);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6b,(ulong)pAVar9);
  Am_Object::Am_Object(&local_60,pAVar10);
  Am_Object::~Am_Object(&local_68);
  Am_Object::Am_Object(&parent_cmd,(Am_Object *)&local_60);
  Am_Object::Add_Part((Am_Object *)&created_objs,SUB81(&parent_cmd,0),1);
  Am_Object::~Am_Object(&parent_cmd);
  Set_LTWH_Anims_On(&local_60,0x6b,true);
  poVar11 = std::operator<<((ostream *)&std::cout,"\n--++-- Created new freehand ");
  poVar11 = (ostream *)operator<<(poVar11,(Am_Object *)&local_60);
  poVar11 = std::operator<<(poVar11," at (");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar2);
  poVar11 = std::operator<<(poVar11,",");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar3);
  poVar11 = std::operator<<(poVar11,")\n");
  std::ostream::operator<<(poVar11,std::flush<char,std::char_traits<char>>);
  Am_Object::Am_Object(&local_78);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)cmd,0x154);
  Am_Object::operator=(&local_78,pAVar6);
  uVar1 = Am_Object::Set((ushort)&local_78,0x154,0);
  pAVar9 = Am_Object::operator_cast_to_Am_Wrapper_(&create_inter);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x170,(ulong)pAVar9);
  pAVar9 = Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x16d,(ulong)pAVar9);
  Am_Object::Copy((char *)&local_80);
  pAVar9 = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x11a,(ulong)pAVar9);
  pAVar9 = Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x169,(ulong)pAVar9);
  uVar1 = Am_Object::Set(uVar1,true,1);
  pAVar9 = Am_Inter_Location::operator_cast_to_Am_Wrapper_(local_40);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x16a,(ulong)pAVar9);
  Am_Object::Set(uVar1,true,0);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_60);
  Am_Style::~Am_Style(local_50);
  Am_Inter_Location::~Am_Inter_Location(local_40);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, freehand_create, (Am_Object cmd))
{
  Am_Object inter;
  inter = cmd.Get(Am_SAVED_OLD_OWNER);
  int left = inter.Get(Am_MIN_X);
  int top = inter.Get(Am_MIN_Y);
  int width = (int)inter.Get(Am_MAX_X) - left;
  int height = (int)inter.Get(Am_MAX_Y) - top;
  Am_Inter_Location data(false, inter.Get_Owner(), left, top, width, height);

  Am_Style color = color_panel.Get_Object(Am_VALUE).Get(Am_FILL_STYLE);

  Am_Object new_object = freehand_line_proto.Create()
                             .Set(Am_POINT_LIST, inter.Get(Am_POINT_LIST))
                             .Set(Am_LINE_STYLE, color);
  created_objs.Add_Part(new_object);

  Set_LTWH_Anims_On(new_object, Am_LINE_STYLE, true);

  std::cout << "\n--++-- Created new freehand " << new_object << " at (" << left
            << "," << top << ")\n"
            << std::flush;

  // Set appropriate slots in implementation parent (to be called next).
  // This parent command is actually the New_Points_Interactor's
  // implementation command.
  Am_Object parent_cmd;
  parent_cmd = cmd.Get(Am_IMPLEMENTATION_PARENT);
  parent_cmd.Set(Am_IMPLEMENTATION_PARENT, 0)
      .Set(Am_SAVED_OLD_OWNER, create_inter, Am_OK_IF_NOT_THERE)
      .Set(Am_OBJECT_MODIFIED, new_object)
      .Set(Am_START_OBJECT, new_object.Copy())
      .Set(Am_VALUE, new_object)
      .Set(Am_AS_LINE, true)
      .Set(Am_INTERIM_VALUE, data)
      .Set(Am_HAS_BEEN_UNDONE, false);
}